

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

bool fmt::v9::detail::check_cstring_type_spec<fmt::v9::detail::error_handler>
               (presentation_type type,error_handler *eh)

{
  uint uVar1;
  undefined7 in_register_00000039;
  
  uVar1 = (uint)CONCAT71(in_register_00000039,type);
  if ((uVar1 < 0x13) && ((0x70001U >> (uVar1 & 0x1f) & 1) != 0)) {
    return type == debug || (type & ~string) == none;
  }
  throw_format_error("invalid type specifier");
}

Assistant:

FMT_CONSTEXPR auto check_cstring_type_spec(presentation_type type,
                                           ErrorHandler&& eh = {}) -> bool {
  if (type == presentation_type::none || type == presentation_type::string ||
      type == presentation_type::debug)
    return true;
  if (type != presentation_type::pointer) eh.on_error("invalid type specifier");
  return false;
}